

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_predictor_16x8_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  long lVar15;
  uint16_t *puVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  
  lVar15 = 0;
  iVar19 = 0;
  iVar20 = 0;
  iVar21 = 0;
  iVar22 = 0;
  do {
    uVar1 = *(ulong *)(above + lVar15);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3._12_2_ = (short)(uVar1 >> 0x30);
    auVar6._8_2_ = (short)(uVar1 >> 0x20);
    auVar6._0_8_ = uVar1;
    auVar6._10_4_ = auVar3._10_4_;
    auVar12._6_8_ = 0;
    auVar12._0_6_ = auVar6._8_6_;
    auVar9._4_2_ = (short)(uVar1 >> 0x10);
    auVar9._0_4_ = (uint)uVar1;
    auVar9._6_8_ = SUB148(auVar12 << 0x40,6);
    iVar19 = iVar19 + ((uint)uVar1 & 0xffff);
    iVar20 = iVar20 + auVar9._4_4_;
    iVar21 = iVar21 + auVar6._8_4_;
    iVar22 = iVar22 + (auVar3._10_4_ >> 0x10);
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0x10);
  uVar1 = *(ulong *)left;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_2_ = (short)(uVar1 >> 0x30);
  auVar7._8_2_ = (short)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._10_4_ = auVar4._10_4_;
  auVar13._6_8_ = 0;
  auVar13._0_6_ = auVar7._8_6_;
  auVar10._4_2_ = (short)(uVar1 >> 0x10);
  auVar10._0_4_ = (uint)uVar1;
  auVar10._6_8_ = SUB148(auVar13 << 0x40,6);
  uVar2 = *(ulong *)(left + 4);
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5._12_2_ = (short)(uVar2 >> 0x30);
  auVar8._8_2_ = (short)(uVar2 >> 0x20);
  auVar8._0_8_ = uVar2;
  auVar8._10_4_ = auVar5._10_4_;
  auVar14._6_8_ = 0;
  auVar14._0_6_ = auVar8._8_6_;
  auVar11._4_2_ = (short)(uVar2 >> 0x10);
  auVar11._0_4_ = (uint)uVar2;
  auVar11._6_8_ = SUB148(auVar14 << 0x40,6);
  auVar18 = ZEXT416(((auVar5._10_4_ >> 0x10) + (auVar4._10_4_ >> 0x10) +
                     auVar11._4_4_ + auVar10._4_4_ +
                     auVar8._8_4_ + auVar7._8_4_ +
                     ((uint)uVar2 & 0xffff) + ((uint)uVar1 & 0xffff) +
                     iVar22 + iVar20 + iVar21 + iVar19 + 0xc >> 3) * 0xaaab >> 0x11);
  auVar18 = pshuflw(auVar18,auVar18,0);
  uVar17 = auVar18._0_4_;
  puVar16 = dst + 8;
  iVar19 = 8;
  do {
    *(undefined4 *)(puVar16 + -8) = uVar17;
    *(undefined4 *)(puVar16 + -6) = uVar17;
    *(undefined4 *)(puVar16 + -4) = uVar17;
    *(undefined4 *)(puVar16 + -2) = uVar17;
    *(undefined4 *)puVar16 = uVar17;
    *(undefined4 *)(puVar16 + 2) = uVar17;
    *(undefined4 *)(puVar16 + 4) = uVar17;
    *(undefined4 *)(puVar16 + 6) = uVar17;
    puVar16 = puVar16 + stride;
    iVar19 = iVar19 + -1;
  } while (iVar19 != 0);
  return;
}

Assistant:

void aom_highbd_dc_predictor_16x8_c(uint16_t *dst, ptrdiff_t stride,
                                    const uint16_t *above, const uint16_t *left,
                                    int bd) {
  highbd_dc_predictor_rect(dst, stride, 16, 8, above, left, bd, 3,
                           HIGHBD_DC_MULTIPLIER_1X2);
}